

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O0

void CompiledMixedType<long,unsigned_char>(void)

{
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs;
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> lhs;
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> lhs_00;
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> lhs_01;
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> lhs_02;
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs_00;
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> lhs_03;
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> lhs_04;
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs_01;
  uchar u2;
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> st2;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> su;
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> st;
  bool b;
  long t;
  uchar u;
  undefined7 in_stack_fffffffffffffce8;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffcef;
  undefined6 in_stack_fffffffffffffcf0;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffcf6;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffcf7;
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffcf8;
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffd00;
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> SVar1;
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffd08;
  undefined7 in_stack_fffffffffffffd10;
  uchar in_stack_fffffffffffffd17;
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffd18;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  SVar2;
  long local_30;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_21;
  long local_20;
  byte local_11;
  long local_10;
  uchar local_1;
  
  local_1 = '\0';
  local_10 = 0;
  local_11 = 0;
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt<unsigned_char>
            ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_fffffffffffffcf7.m_int,
                         CONCAT16(in_stack_fffffffffffffcf6.m_int,in_stack_fffffffffffffcf0)),
             (uchar *)CONCAT17(in_stack_fffffffffffffcef.m_int,in_stack_fffffffffffffce8));
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt(&local_21,&local_1);
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt<unsigned_char>
            ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffd00.m_int,
             (SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffcf8.m_int);
  local_11 = (local_11 ^ 0xff) & 1;
  SafeInt<long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffd00.m_int,(long *)in_stack_fffffffffffffcf8.m_int);
  SafeInt<long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffd00.m_int,(uchar *)in_stack_fffffffffffffcf8.m_int);
  SafeInt<long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_fffffffffffffcf7.m_int,
                         CONCAT16(in_stack_fffffffffffffcf6.m_int,in_stack_fffffffffffffcf0)),
             (SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_fffffffffffffcef.m_int,in_stack_fffffffffffffce8));
  local_20 = local_30;
  SafeInt::operator_cast_to_unsigned_char
            ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_fffffffffffffcf7.m_int,
                         CONCAT16(in_stack_fffffffffffffcf6.m_int,in_stack_fffffffffffffcf0)));
  SafeInt<long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator*
            ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffcf8.m_int,in_stack_fffffffffffffcf7.m_int);
  local_10 = SafeInt::operator_cast_to_long
                       ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT17(in_stack_fffffffffffffcf7.m_int,
                                    CONCAT16(in_stack_fffffffffffffcf6.m_int,
                                             in_stack_fffffffffffffcf0)));
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator*
            ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffd00.m_int,in_stack_fffffffffffffd08);
  local_10 = SafeInt::operator_cast_to_long
                       ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT17(in_stack_fffffffffffffcf7.m_int,
                                    CONCAT16(in_stack_fffffffffffffcf6.m_int,
                                             in_stack_fffffffffffffcf0)));
  operator*(in_stack_fffffffffffffcf7.m_int,in_stack_fffffffffffffcf8);
  local_10 = SafeInt::operator_cast_to_long
                       ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT17(in_stack_fffffffffffffcf7.m_int,
                                    CONCAT16(in_stack_fffffffffffffcf6.m_int,
                                             in_stack_fffffffffffffcf0)));
  SafeInt<long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator*=
            ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_fffffffffffffcf7.m_int,
                         CONCAT16(in_stack_fffffffffffffcf6.m_int,in_stack_fffffffffffffcf0)),
             in_stack_fffffffffffffcef.m_int);
  SafeInt<long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator*=
            ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_fffffffffffffcef.m_int,in_stack_fffffffffffffce8),
             in_stack_fffffffffffffcf7);
  local_1 = '\x01';
  SafeInt<long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffd00.m_int,(int *)in_stack_fffffffffffffcf8.m_int);
  SafeInt<unsigned_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffd00.m_int,(int *)in_stack_fffffffffffffcf8.m_int);
  SafeInt<long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator%
            ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffcf8.m_int,in_stack_fffffffffffffcf7.m_int);
  local_10 = SafeInt::operator_cast_to_long
                       ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT17(in_stack_fffffffffffffcf7.m_int,
                                    CONCAT16(in_stack_fffffffffffffcf6.m_int,
                                             in_stack_fffffffffffffcf0)));
  SafeInt<long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffd00.m_int,(int *)in_stack_fffffffffffffcf8.m_int);
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator%
            ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffd00.m_int,in_stack_fffffffffffffd08);
  local_10 = SafeInt::operator_cast_to_long
                       ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT17(in_stack_fffffffffffffcf7.m_int,
                                    CONCAT16(in_stack_fffffffffffffcf6.m_int,
                                             in_stack_fffffffffffffcf0)));
  SafeInt<long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator%=
            ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_fffffffffffffcf7.m_int,
                         CONCAT16(in_stack_fffffffffffffcf6.m_int,in_stack_fffffffffffffcf0)),
             in_stack_fffffffffffffcef.m_int);
  SafeInt<long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator%=
            ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffcf8.m_int,
             (SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              )(uchar)((ulong)in_stack_fffffffffffffd00.m_int >> 0x38));
  local_1 = '\x01';
  SafeInt<long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffd00.m_int,(int *)in_stack_fffffffffffffcf8.m_int);
  SafeInt<long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffd00.m_int,(int *)in_stack_fffffffffffffcf8.m_int);
  SafeInt<long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator/
            ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffcf8.m_int,in_stack_fffffffffffffcf7.m_int);
  local_10 = SafeInt::operator_cast_to_long
                       ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT17(in_stack_fffffffffffffcf7.m_int,
                                    CONCAT16(in_stack_fffffffffffffcf6.m_int,
                                             in_stack_fffffffffffffcf0)));
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator/
            ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffd00.m_int,in_stack_fffffffffffffd08);
  local_10 = SafeInt::operator_cast_to_long
                       ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT17(in_stack_fffffffffffffcf7.m_int,
                                    CONCAT16(in_stack_fffffffffffffcf6.m_int,
                                             in_stack_fffffffffffffcf0)));
  operator/(in_stack_fffffffffffffd17,in_stack_fffffffffffffd18);
  SVar2.m_int = (uchar)((ulong)in_stack_fffffffffffffd18.m_int >> 0x38);
  local_10 = SafeInt::operator_cast_to_long
                       ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT17(in_stack_fffffffffffffcf7.m_int,
                                    CONCAT16(in_stack_fffffffffffffcf6.m_int,
                                             in_stack_fffffffffffffcf0)));
  SafeInt<long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator/=
            ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_fffffffffffffcf7.m_int,
                         CONCAT16(in_stack_fffffffffffffcf6.m_int,in_stack_fffffffffffffcf0)),
             in_stack_fffffffffffffcef.m_int);
  SafeInt<long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator/=
            ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffcf8.m_int,
             (SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              )(uchar)((ulong)in_stack_fffffffffffffd00.m_int >> 0x38));
  SafeInt<long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator+
            ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffcf8.m_int,in_stack_fffffffffffffcf7.m_int);
  local_10 = SafeInt::operator_cast_to_long
                       ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT17(in_stack_fffffffffffffcf7.m_int,
                                    CONCAT16(in_stack_fffffffffffffcf6.m_int,
                                             in_stack_fffffffffffffcf0)));
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator+
            ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffd00.m_int,in_stack_fffffffffffffd08);
  local_10 = SafeInt::operator_cast_to_long
                       ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT17(in_stack_fffffffffffffcf7.m_int,
                                    CONCAT16(in_stack_fffffffffffffcf6.m_int,
                                             in_stack_fffffffffffffcf0)));
  operator+(in_stack_fffffffffffffcf7.m_int,in_stack_fffffffffffffcf8);
  local_10 = SafeInt::operator_cast_to_long
                       ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT17(in_stack_fffffffffffffcf7.m_int,
                                    CONCAT16(in_stack_fffffffffffffcf6.m_int,
                                             in_stack_fffffffffffffcf0)));
  SafeInt<long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator+=
            ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_fffffffffffffcf7.m_int,
                         CONCAT16(in_stack_fffffffffffffcf6.m_int,in_stack_fffffffffffffcf0)),
             in_stack_fffffffffffffcef.m_int);
  SafeInt<long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator+=
            ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffcf8.m_int,
             (SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              )(uchar)((ulong)in_stack_fffffffffffffd00.m_int >> 0x38));
  SafeInt<long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffd00.m_int,(int *)in_stack_fffffffffffffcf8.m_int);
  local_1 = '\0';
  SafeInt<long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffd00.m_int,(int *)in_stack_fffffffffffffcf8.m_int);
  SafeInt<long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator-
            ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffcf8.m_int,in_stack_fffffffffffffcf7.m_int);
  local_10 = SafeInt::operator_cast_to_long
                       ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT17(in_stack_fffffffffffffcf7.m_int,
                                    CONCAT16(in_stack_fffffffffffffcf6.m_int,
                                             in_stack_fffffffffffffcf0)));
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator-
            ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffd00.m_int,in_stack_fffffffffffffd08);
  local_10 = SafeInt::operator_cast_to_long
                       ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT17(in_stack_fffffffffffffcf7.m_int,
                                    CONCAT16(in_stack_fffffffffffffcf6.m_int,
                                             in_stack_fffffffffffffcf0)));
  operator-(in_stack_fffffffffffffcf7.m_int,in_stack_fffffffffffffcf8);
  local_10 = SafeInt::operator_cast_to_long
                       ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT17(in_stack_fffffffffffffcf7.m_int,
                                    CONCAT16(in_stack_fffffffffffffcf6.m_int,
                                             in_stack_fffffffffffffcf0)));
  SafeInt<long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator-=
            ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_fffffffffffffcf7.m_int,
                         CONCAT16(in_stack_fffffffffffffcf6.m_int,in_stack_fffffffffffffcf0)),
             in_stack_fffffffffffffcef.m_int);
  SafeInt<long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffd00.m_int,(int *)in_stack_fffffffffffffcf8.m_int);
  SafeInt<unsigned_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffd00.m_int,(int *)in_stack_fffffffffffffcf8.m_int);
  SafeInt<long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator-=
            ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffcf8.m_int,
             (SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              )(uchar)((ulong)in_stack_fffffffffffffd00.m_int >> 0x38));
  local_1 = '\x01';
  SafeInt<unsigned_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffd00.m_int,(int *)in_stack_fffffffffffffcf8.m_int);
  SafeInt<long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator<<
            ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffcf8.m_int,in_stack_fffffffffffffcf7.m_int);
  local_10 = SafeInt::operator_cast_to_long
                       ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT17(in_stack_fffffffffffffcf7.m_int,
                                    CONCAT16(in_stack_fffffffffffffcf6.m_int,
                                             in_stack_fffffffffffffcf0)));
  SafeInt<long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator<<
            ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),SVar2);
  local_10 = SafeInt::operator_cast_to_long
                       ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT17(in_stack_fffffffffffffcf7.m_int,
                                    CONCAT16(in_stack_fffffffffffffcf6.m_int,
                                             in_stack_fffffffffffffcf0)));
  operator<<(in_stack_fffffffffffffd00.m_int,
             (SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              )(uchar)((ulong)in_stack_fffffffffffffd08.m_int >> 0x38));
  local_10 = SafeInt::operator_cast_to_long
                       ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT17(in_stack_fffffffffffffcf7.m_int,
                                    CONCAT16(in_stack_fffffffffffffcf6.m_int,
                                             in_stack_fffffffffffffcf0)));
  SafeInt<long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator<<=
            ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_fffffffffffffcf7.m_int,
                         CONCAT16(in_stack_fffffffffffffcf6.m_int,in_stack_fffffffffffffcf0)),
             in_stack_fffffffffffffcef.m_int);
  SafeInt<long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator<<=
            ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffcf8.m_int,
             (SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              )(uchar)((ulong)in_stack_fffffffffffffd00.m_int >> 0x38));
  SafeInt<long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator>>
            ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffcf8.m_int,in_stack_fffffffffffffcf7.m_int);
  local_10 = SafeInt::operator_cast_to_long
                       ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT17(in_stack_fffffffffffffcf7.m_int,
                                    CONCAT16(in_stack_fffffffffffffcf6.m_int,
                                             in_stack_fffffffffffffcf0)));
  SafeInt<long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator>>
            ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),SVar2);
  local_10 = SafeInt::operator_cast_to_long
                       ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT17(in_stack_fffffffffffffcf7.m_int,
                                    CONCAT16(in_stack_fffffffffffffcf6.m_int,
                                             in_stack_fffffffffffffcf0)));
  operator>>(in_stack_fffffffffffffd00.m_int,
             (SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              )(uchar)((ulong)in_stack_fffffffffffffd08.m_int >> 0x38));
  local_10 = SafeInt::operator_cast_to_long
                       ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT17(in_stack_fffffffffffffcf7.m_int,
                                    CONCAT16(in_stack_fffffffffffffcf6.m_int,
                                             in_stack_fffffffffffffcf0)));
  SafeInt<long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator>>=
            ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_fffffffffffffcf7.m_int,
                         CONCAT16(in_stack_fffffffffffffcf6.m_int,in_stack_fffffffffffffcf0)),
             in_stack_fffffffffffffcef.m_int);
  SafeInt<long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator>>=
            ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffcf8.m_int,
             (SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              )(uchar)((ulong)in_stack_fffffffffffffd00.m_int >> 0x38));
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator&
            ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffd00.m_int,in_stack_fffffffffffffd08);
  local_10 = SafeInt::operator_cast_to_long
                       ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT17(in_stack_fffffffffffffcf7.m_int,
                                    CONCAT16(in_stack_fffffffffffffcf6.m_int,
                                             in_stack_fffffffffffffcf0)));
  SafeInt<long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator&
            ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffcf8.m_int,in_stack_fffffffffffffcf7.m_int);
  local_10 = SafeInt::operator_cast_to_long
                       ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT17(in_stack_fffffffffffffcf7.m_int,
                                    CONCAT16(in_stack_fffffffffffffcf6.m_int,
                                             in_stack_fffffffffffffcf0)));
  operator&(CONCAT17(in_stack_fffffffffffffcef.m_int,in_stack_fffffffffffffce8),
            in_stack_fffffffffffffcf6);
  local_10 = SafeInt::operator_cast_to_long
                       ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT17(in_stack_fffffffffffffcf7.m_int,
                                    CONCAT16(in_stack_fffffffffffffcf6.m_int,
                                             in_stack_fffffffffffffcf0)));
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator&=
            ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffcf8.m_int,in_stack_fffffffffffffd00);
  SafeInt<long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator&=
            ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_fffffffffffffcf7.m_int,
                         CONCAT16(in_stack_fffffffffffffcf6.m_int,in_stack_fffffffffffffcf0)),
             in_stack_fffffffffffffcef.m_int);
  SafeInt<long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator&=
            ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffcf8.m_int,
             (SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              )(uchar)((ulong)in_stack_fffffffffffffd00.m_int >> 0x38));
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator|
            ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffd00.m_int,in_stack_fffffffffffffd08);
  local_10 = SafeInt::operator_cast_to_long
                       ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT17(in_stack_fffffffffffffcf7.m_int,
                                    CONCAT16(in_stack_fffffffffffffcf6.m_int,
                                             in_stack_fffffffffffffcf0)));
  SafeInt<long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator|
            ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffcf8.m_int,in_stack_fffffffffffffcf7.m_int);
  local_10 = SafeInt::operator_cast_to_long
                       ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT17(in_stack_fffffffffffffcf7.m_int,
                                    CONCAT16(in_stack_fffffffffffffcf6.m_int,
                                             in_stack_fffffffffffffcf0)));
  operator|(CONCAT17(in_stack_fffffffffffffcef.m_int,in_stack_fffffffffffffce8),
            in_stack_fffffffffffffcf6);
  local_10 = SafeInt::operator_cast_to_long
                       ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT17(in_stack_fffffffffffffcf7.m_int,
                                    CONCAT16(in_stack_fffffffffffffcf6.m_int,
                                             in_stack_fffffffffffffcf0)));
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator|=
            ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffcf8.m_int,in_stack_fffffffffffffd00);
  SafeInt<long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator|=
            ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_fffffffffffffcf7.m_int,
                         CONCAT16(in_stack_fffffffffffffcf6.m_int,in_stack_fffffffffffffcf0)),
             in_stack_fffffffffffffcef.m_int);
  SafeInt<long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator|=
            ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffcf8.m_int,
             (SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              )(uchar)((ulong)in_stack_fffffffffffffd00.m_int >> 0x38));
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator^
            ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffd00.m_int,in_stack_fffffffffffffd08);
  local_10 = SafeInt::operator_cast_to_long
                       ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT17(in_stack_fffffffffffffcf7.m_int,
                                    CONCAT16(in_stack_fffffffffffffcf6.m_int,
                                             in_stack_fffffffffffffcf0)));
  SafeInt<long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator^
            ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffcf8.m_int,in_stack_fffffffffffffcf7.m_int);
  local_10 = SafeInt::operator_cast_to_long
                       ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT17(in_stack_fffffffffffffcf7.m_int,
                                    CONCAT16(in_stack_fffffffffffffcf6.m_int,
                                             in_stack_fffffffffffffcf0)));
  operator^(CONCAT17(in_stack_fffffffffffffcef.m_int,in_stack_fffffffffffffce8),
            in_stack_fffffffffffffcf6);
  local_10 = SafeInt::operator_cast_to_long
                       ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT17(in_stack_fffffffffffffcf7.m_int,
                                    CONCAT16(in_stack_fffffffffffffcf6.m_int,
                                             in_stack_fffffffffffffcf0)));
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator^=
            ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffcf8.m_int,in_stack_fffffffffffffd00);
  SafeInt<long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator^=
            ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT17(in_stack_fffffffffffffcf7.m_int,
                         CONCAT16(in_stack_fffffffffffffcf6.m_int,in_stack_fffffffffffffcf0)),
             in_stack_fffffffffffffcef.m_int);
  SafeInt<long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator^=
            ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffcf8.m_int,
             (SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              )(uchar)((ulong)in_stack_fffffffffffffd00.m_int >> 0x38));
  SVar2.m_int = (uchar)((ulong)in_stack_fffffffffffffcf8.m_int >> 0x38);
  SVar1.m_int._6_1_ = in_stack_fffffffffffffcf6.m_int;
  SVar1.m_int._0_6_ = in_stack_fffffffffffffcf0;
  SVar1.m_int._7_1_ = in_stack_fffffffffffffcf7.m_int;
  local_11 = operator<(SVar1,in_stack_fffffffffffffcef);
  local_11 = operator<(in_stack_fffffffffffffd00,SVar2.m_int);
  rhs.m_int._6_1_ = in_stack_fffffffffffffcf6.m_int;
  rhs.m_int._0_6_ = in_stack_fffffffffffffcf0;
  rhs.m_int._7_1_ = in_stack_fffffffffffffcf7.m_int;
  local_11 = operator<(in_stack_fffffffffffffcef.m_int,rhs);
  lhs.m_int._6_1_ = in_stack_fffffffffffffcf6.m_int;
  lhs.m_int._0_6_ = in_stack_fffffffffffffcf0;
  lhs.m_int._7_1_ = in_stack_fffffffffffffcf7.m_int;
  local_11 = operator<(lhs,in_stack_fffffffffffffcef);
  local_11 = operator<=(in_stack_fffffffffffffd00,SVar2);
  lhs_00.m_int._6_1_ = in_stack_fffffffffffffcf6.m_int;
  lhs_00.m_int._0_6_ = in_stack_fffffffffffffcf0;
  lhs_00.m_int._7_1_ = in_stack_fffffffffffffcf7.m_int;
  local_11 = operator<=(lhs_00,in_stack_fffffffffffffcef.m_int);
  local_11 = operator<=(SVar2.m_int,in_stack_fffffffffffffd00);
  local_11 = operator<=(in_stack_fffffffffffffd00,SVar2);
  local_11 = operator>(in_stack_fffffffffffffd00,SVar2);
  lhs_01.m_int._6_1_ = in_stack_fffffffffffffcf6.m_int;
  lhs_01.m_int._0_6_ = in_stack_fffffffffffffcf0;
  lhs_01.m_int._7_1_ = in_stack_fffffffffffffcf7.m_int;
  local_11 = operator>(lhs_01,in_stack_fffffffffffffcef.m_int);
  local_11 = operator>(SVar2.m_int,in_stack_fffffffffffffd00);
  local_11 = operator>(in_stack_fffffffffffffd00,SVar2);
  lhs_02.m_int._6_1_ = in_stack_fffffffffffffcf6.m_int;
  lhs_02.m_int._0_6_ = in_stack_fffffffffffffcf0;
  lhs_02.m_int._7_1_ = in_stack_fffffffffffffcf7.m_int;
  local_11 = operator>=(lhs_02,in_stack_fffffffffffffcef);
  local_11 = operator>=(in_stack_fffffffffffffd00,SVar2.m_int);
  rhs_00.m_int._6_1_ = in_stack_fffffffffffffcf6.m_int;
  rhs_00.m_int._0_6_ = in_stack_fffffffffffffcf0;
  rhs_00.m_int._7_1_ = in_stack_fffffffffffffcf7.m_int;
  local_11 = operator>=(in_stack_fffffffffffffcef.m_int,rhs_00);
  lhs_03.m_int._6_1_ = in_stack_fffffffffffffcf6.m_int;
  lhs_03.m_int._0_6_ = in_stack_fffffffffffffcf0;
  lhs_03.m_int._7_1_ = in_stack_fffffffffffffcf7.m_int;
  local_11 = operator>=(lhs_03,in_stack_fffffffffffffcef);
  local_11 = operator==(in_stack_fffffffffffffd00,SVar2);
  lhs_04.m_int._6_1_ = in_stack_fffffffffffffcf6.m_int;
  lhs_04.m_int._0_6_ = in_stack_fffffffffffffcf0;
  lhs_04.m_int._7_1_ = in_stack_fffffffffffffcf7.m_int;
  local_11 = operator==(lhs_04,in_stack_fffffffffffffcef.m_int);
  rhs_01.m_int._6_1_ = in_stack_fffffffffffffcf6.m_int;
  rhs_01.m_int._0_6_ = in_stack_fffffffffffffcf0;
  rhs_01.m_int._7_1_ = in_stack_fffffffffffffcf7.m_int;
  SVar1.m_int = local_20;
  local_11 = operator==(in_stack_fffffffffffffcef.m_int,rhs_01);
  operator==(SVar1,(SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                    )(uchar)((ulong)local_20 >> 0x38));
  return;
}

Assistant:

void CompiledMixedType()
{
	// Mixed constructors
	U u = 0;
	T t = 0;
	bool b = false;
	SafeInt<T> st(u);
	SafeInt<U> su(u);
	SafeInt<T> st2(su);

	// Shut up the compiler
	b = !b;

	// Assignment
	st = t;
	st = u;
	st = su;
	st = st2;

	// Casting
	U u2 = (U)st;

	// Multiplication
	t = st * u;
	t = st * st2;
	t = u * st;
	st *= u;
	st *= su;

	// Modulus, modulus assignment
	u = 1;
	st = 1;
	su = 1;
	// For some reason, this is annoying the VS17 link time code generation
//	t = u % st;

	t = st % u;
	st2 = 1;
	t = st % st2;
	st %= u;
	st %= su;

	// Division
	u = 1;
	st2 = 1;
	st = 1;
	t = st / u;
	t = st / st2;
	t = u / st;
	st /= u;
	st /= su;

	// Addition
	t = st + u;
	t = st + st2;
	t = u + st;
	st += u;
	st += su;

	// Subtraction
	st = 0;
	u = 0;
	st2 = 0;
	t = st - u;
	t = st - st2;
	t = u - st;
	st -= u;

	st = 1;
	su = 1;
	st -= su;

	// Shift operators
	u = 1;
	su = 1;
	// Left
	t = st << u;
	t = st << su;
	t = t << su;

	st <<= u;
	st <<= su;

	// Right
	t = st >> u;
	t = st >> su;
	t = t >> su;

	st >>= u;
	st >>= su;

	// Binary operations
	// And
	t = st & st2;
	t = st & u;
	t = t & su;

	st &= st2;
	st &= u;
	st &= su;

	// Or
	t = st | st2;
	t = st | u;
	t = t | su;

	st |= st2;
	st |= u;
	st |= su;

	// Xor
	t = st ^ st2;
	t = st ^ u;
	t = t ^ su;

	st ^= st2;
	st ^= u;
	st ^= su;

	// Comparisons
	// Less than
	b = st < su;
	b = st < u;
	b = u < st;
	b = st < su;

	// Less than or equal
	b = st <= su;
	b = st <= u;
	b = u <= st;
	b = st <= su;

	// Greater than
	b = st > su;
	b = st > u;
	b = u > st;
	b = st > su;

	// Greater than or equal
	b = st >= su;
	b = st >= u;
	b = u >= st;
	b = st >= su;

	// Equals
	b = st == su;
	b = st == u;
	b = u == st;
	b = st == su;
}